

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  App **ppAVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  Classifier CVar5;
  App *pAVar6;
  long lVar7;
  App *pAVar8;
  Option *pOVar9;
  Classifier CVar10;
  string dummy2;
  string dummy1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  iVar4 = ::std::__cxx11::string::compare((char *)current);
  pAVar8 = this;
  if (iVar4 == 0) {
    CVar10 = POSITIONAL_MARK;
    goto LAB_00141663;
  }
  do {
    if (((pAVar8->require_subcommand_max_ == 0) ||
        ((ulong)((long)(pAVar8->parsed_subcommands_).
                       super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pAVar8->parsed_subcommands_).
                       super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) < pAVar8->require_subcommand_max_)) ||
       (pAVar8->subcommand_fallthrough_ != true)) {
      pAVar6 = _find_subcommand(pAVar8,current,true,ignore_used_subcommands);
      if (pAVar6 != (App *)0x0) {
        CVar10 = SUBCOMMAND;
        goto LAB_00141663;
      }
      if (pAVar8->subcommand_fallthrough_ != true) break;
    }
    ppAVar1 = &pAVar8->parent_;
    pAVar8 = *ppAVar1;
  } while (*ppAVar1 != (App *)0x0);
  bVar3 = detail::split_long(current,&local_70,&local_90);
  CVar10 = LONG;
  if (bVar3) goto LAB_00141663;
  bVar3 = detail::split_short(current,&local_70,&local_90);
  if (bVar3) {
    bVar2 = *local_70._M_dataplus._M_p;
    if ((char)bVar2 < 0x30) {
      if (((bVar2 == 0x2e) && (local_90._M_string_length != 0)) &&
         ((byte)(*local_90._M_dataplus._M_p - 0x30U) < 10)) goto LAB_0014160a;
    }
    else if (bVar2 < 0x3a) {
LAB_0014160a:
      local_50.field_2._M_allocated_capacity._0_2_ = (short)(char)bVar2 << 8 | 0x2d;
      local_50._M_string_length = 2;
      local_50.field_2._M_local_buf[2] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pOVar9 = get_option_no_throw(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT53(local_50.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_50.field_2._M_local_buf[2],
                                          local_50.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      if (pOVar9 == (Option *)0x0) goto LAB_00141660;
    }
    CVar10 = SHORT;
  }
  else {
    if (this->allow_windows_style_options_ == true) {
      bVar3 = detail::split_windows_style(current,&local_70,&local_90);
      CVar10 = WINDOWS_STYLE;
      if (bVar3) goto LAB_00141663;
    }
    iVar4 = ::std::__cxx11::string::compare((char *)current);
    if (((iVar4 == 0) && ((this->name_)._M_string_length != 0)) &&
       (CVar10 = SUBCOMMAND_TERMINATOR, this->parent_ != (App *)0x0)) goto LAB_00141663;
    lVar7 = ::std::__cxx11::string::find((char)current,0x2e);
    if (lVar7 != -1) {
      ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
      pAVar8 = _find_subcommand(this,&local_b0,true,ignore_used_subcommands);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (pAVar8 != (App *)0x0) {
        ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
        CVar5 = _recognize(pAVar8,&local_b0,ignore_used_subcommands);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        CVar10 = SUBCOMMAND;
        if (CVar5 == SUBCOMMAND) goto LAB_00141663;
      }
    }
LAB_00141660:
    CVar10 = NONE;
  }
LAB_00141663:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return CVar10;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE detail::Classifier App::_recognize(const std::string &current,
                                                                bool ignore_used_subcommands) const {
    std::string dummy1, dummy2;

    if(current == "--")
        return detail::Classifier::POSITIONAL_MARK;
    if(_valid_subcommand(current, ignore_used_subcommands))
        return detail::Classifier::SUBCOMMAND;
    if(detail::split_long(current, dummy1, dummy2))
        return detail::Classifier::LONG;
    if(detail::split_short(current, dummy1, dummy2)) {
        if((dummy1[0] >= '0' && dummy1[0] <= '9') ||
           (dummy1[0] == '.' && !dummy2.empty() && (dummy2[0] >= '0' && dummy2[0] <= '9'))) {
            // it looks like a number but check if it could be an option
            if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                return detail::Classifier::NONE;
            }
        }
        return detail::Classifier::SHORT;
    }
    if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
        return detail::Classifier::WINDOWS_STYLE;
    if((current == "++") && !name_.empty() && parent_ != nullptr)
        return detail::Classifier::SUBCOMMAND_TERMINATOR;
    auto dotloc = current.find_first_of('.');
    if(dotloc != std::string::npos) {
        auto *cm = _find_subcommand(current.substr(0, dotloc), true, ignore_used_subcommands);
        if(cm != nullptr) {
            auto res = cm->_recognize(current.substr(dotloc + 1), ignore_used_subcommands);
            if(res == detail::Classifier::SUBCOMMAND) {
                return res;
            }
        }
    }
    return detail::Classifier::NONE;
}